

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int archive_read_add_callback_data(archive *_a,void *client_data,uint iindex)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_add_callback_data");
  if (iVar1 != -0x1e) {
    if (_a[1].current_codepage < iindex) {
      pcVar3 = "Invalid index specified.";
      iVar1 = 0x16;
    }
    else {
      uVar2 = _a[1].current_codepage + 1;
      _a[1].current_codepage = uVar2;
      pcVar3 = (char *)realloc(_a[1].read_data_block,(ulong)uVar2 * 0x18);
      if (pcVar3 != (char *)0x0) {
        _a[1].read_data_block = pcVar3;
        pcVar4 = pcVar3 + (ulong)(_a[1].current_codepage - 1) * 0x18 + 0x10;
        for (uVar2 = _a[1].current_codepage - 2; iindex < uVar2 + 1; uVar2 = uVar2 - 1) {
          *(undefined8 *)pcVar4 = *(undefined8 *)(pcVar3 + (ulong)uVar2 * 0x18 + 0x10);
          pcVar4[-0x10] = -1;
          pcVar4[-0xf] = -1;
          pcVar4[-0xe] = -1;
          pcVar4[-0xd] = -1;
          pcVar4[-0xc] = -1;
          pcVar4[-0xb] = -1;
          pcVar4[-10] = -1;
          pcVar4[-9] = -1;
          pcVar4[-8] = -1;
          pcVar4[-7] = -1;
          pcVar4[-6] = -1;
          pcVar4[-5] = -1;
          pcVar4[-4] = -1;
          pcVar4[-3] = -1;
          pcVar4[-2] = -1;
          pcVar4[-1] = -1;
          pcVar4 = pcVar4 + -0x18;
        }
        *(void **)(pcVar3 + (ulong)iindex * 0x18 + 0x10) = client_data;
        pcVar3 = pcVar3 + (ulong)iindex * 0x18;
        pcVar3[0] = -1;
        pcVar3[1] = -1;
        pcVar3[2] = -1;
        pcVar3[3] = -1;
        pcVar3[4] = -1;
        pcVar3[5] = -1;
        pcVar3[6] = -1;
        pcVar3[7] = -1;
        pcVar3[8] = -1;
        pcVar3[9] = -1;
        pcVar3[10] = -1;
        pcVar3[0xb] = -1;
        pcVar3[0xc] = -1;
        pcVar3[0xd] = -1;
        pcVar3[0xe] = -1;
        pcVar3[0xf] = -1;
        return 0;
      }
      pcVar3 = "No memory.";
      iVar1 = 0xc;
    }
    archive_set_error(_a,iVar1,pcVar3);
  }
  return -0x1e;
}

Assistant:

int
archive_read_add_callback_data(struct archive *_a, void *client_data,
    unsigned int iindex)
{
	struct archive_read *a = (struct archive_read *)_a;
	void *p;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_add_callback_data");
	if (iindex > a->client.nodes) {
		archive_set_error(&a->archive, EINVAL,
			"Invalid index specified.");
		return ARCHIVE_FATAL;
	}
	p = realloc(a->client.dataset, sizeof(*a->client.dataset)
		* (++(a->client.nodes)));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM,
			"No memory.");
		return ARCHIVE_FATAL;
	}
	a->client.dataset = (struct archive_read_data_node *)p;
	for (i = a->client.nodes - 1; i > iindex; i--) {
		a->client.dataset[i].data = a->client.dataset[i-1].data;
		a->client.dataset[i].begin_position = -1;
		a->client.dataset[i].total_size = -1;
	}
	a->client.dataset[iindex].data = client_data;
	a->client.dataset[iindex].begin_position = -1;
	a->client.dataset[iindex].total_size = -1;
	return ARCHIVE_OK;
}